

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5efc::TestCheckArray2DCloseFailureContainsCorrectDetails::RunImpl
          (TestCheckArray2DCloseFailureContainsCorrectDetails *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  int line;
  TestDetails testDetails;
  ScopedCurrentTest scopedResults;
  int data2 [2] [2];
  int data1 [2] [2];
  TestResults testResults;
  RecordingReporter reporter;
  int local_8d4;
  TestDetails local_8d0;
  float local_8ac;
  ScopedCurrentTest local_8a8;
  int local_898 [2];
  int aiStack_890 [2];
  int local_888 [2];
  int aiStack_880 [2];
  TestDetails local_878;
  TestResults local_858;
  TestReporter local_840;
  undefined4 local_838;
  undefined1 local_834;
  undefined1 local_734;
  undefined4 local_634;
  char local_630 [256];
  int local_530;
  char local_52c [256];
  char local_42c [256];
  undefined1 local_32c;
  undefined4 local_22c;
  undefined1 local_228;
  undefined1 local_128;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_18;
  
  local_8d4 = 0;
  local_840._vptr_TestReporter = (_func_int **)&PTR__TestReporter_00150810;
  local_838 = 0;
  local_634 = 0;
  local_530 = 0;
  local_22c = 0;
  local_834 = 0;
  local_734 = 0;
  local_630[0] = '\0';
  local_52c[0] = '\0';
  local_42c[0] = '\0';
  local_32c = 0;
  local_228 = 0;
  local_128 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  UnitTest::TestResults::TestResults(&local_858,&local_840);
  UnitTest::TestDetails::TestDetails
            (&local_8d0,"array2DCloseTest","array2DCloseSuite","filename",-1);
  ScopedCurrentTest::ScopedCurrentTest(&local_8a8,&local_858,&local_8d0);
  local_888[0] = 0;
  local_888[1] = 1;
  aiStack_880[0] = 2;
  aiStack_880[1] = 3;
  local_898[0] = 0;
  local_898[1] = 1;
  aiStack_890[0] = 3;
  aiStack_890[1] = 3;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_8ac = 0.01;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_878,*ppTVar3,0x2b1);
  UnitTest::CheckArray2DClose<int[2][2],int[2][2],float>
            (pTVar1,(int (*) [2] [2])local_888,(int (*) [2] [2])local_898,2,2,&local_8ac,&local_878)
  ;
  local_8d4 = 0x2b1;
  ScopedCurrentTest::~ScopedCurrentTest(&local_8a8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8d0,*ppTVar3,0x2b4);
  UnitTest::CheckEqual(pTVar1,"array2DCloseTest",local_42c,&local_8d0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8d0,*ppTVar3,0x2b5);
  UnitTest::CheckEqual(pTVar1,"array2DCloseSuite",local_52c,&local_8d0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8d0,*ppTVar3,0x2b6);
  UnitTest::CheckEqual(pTVar1,"filename",local_630,&local_8d0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8d0,*ppTVar3,0x2b7);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_8d4,&local_530,&local_8d0);
  UnitTest::TestReporter::~TestReporter(&local_840);
  return;
}

Assistant:

TEST(CheckArray2DCloseFailureContainsCorrectDetails)
{
    int line = 0;
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		UnitTest::TestDetails testDetails("array2DCloseTest", "array2DCloseSuite", "filename", -1);
		ScopedCurrentTest scopedResults(testResults, &testDetails);

		int const data1[2][2] = { {0, 1}, {2, 3} };
        int const data2[2][2] = { {0, 1}, {3, 3} };
		CHECK_ARRAY2D_CLOSE (data1, data2, 2, 2, 0.01f);     line = __LINE__;
    }

    CHECK_EQUAL("array2DCloseTest", reporter.lastFailedTest);
    CHECK_EQUAL("array2DCloseSuite", reporter.lastFailedSuite);
    CHECK_EQUAL("filename", reporter.lastFailedFile);
    CHECK_EQUAL(line, reporter.lastFailedLine);
}